

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzD.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAxyzD::NodeIntStateScatterAcceleration
          (ChNodeFEAxyzD *this,uint off_a,ChStateDelta *a)

{
  double *local_90;
  undefined8 local_88;
  ChStateDelta *local_78;
  ulong local_70;
  long local_60;
  ChVector<double> local_58;
  ChVector<double> local_38;
  
  local_70 = (ulong)off_a;
  local_90 = (a->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             local_70;
  local_60 = (a->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_88 = 3;
  if ((long)local_70 <= local_60 + -3) {
    local_78 = a;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_38,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)&local_90,(type *)0x0);
    if ((ChVector<double> *)&(this->super_ChNodeFEAxyz).field_0x50 != &local_38) {
      *(double *)&(this->super_ChNodeFEAxyz).field_0x50 = local_38.m_data[0];
      *(double *)&(this->super_ChNodeFEAxyz).field_0x58 = local_38.m_data[1];
      *(double *)&(this->super_ChNodeFEAxyz).field_0x60 = local_38.m_data[2];
    }
    local_70 = (ulong)(off_a + 3);
    local_60 = (a->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_90 = (a->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               local_70;
    local_88 = 3;
    if ((long)local_70 <= local_60 + -3) {
      local_78 = a;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&local_58,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_90,(type *)0x0);
      if (&this->D_dtdt != &local_58) {
        (this->D_dtdt).m_data[0] = local_58.m_data[0];
        (this->D_dtdt).m_data[1] = local_58.m_data[1];
        (this->D_dtdt).m_data[2] = local_58.m_data[2];
      }
      return;
    }
  }
  local_88 = 3;
  local_78 = a;
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChNodeFEAxyzD::NodeIntStateScatterAcceleration(const unsigned int off_a, const ChStateDelta& a) {
    SetPos_dtdt(a.segment(off_a, 3));
    SetD_dtdt(a.segment(off_a + 3, 3));
}